

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  long lVar1;
  Db *pDVar2;
  SrcList *pSVar3;
  Expr *pEVar4;
  ExprList *pEVar5;
  With *pWVar6;
  Window *pWVar7;
  int in_EDX;
  sqlite3 *in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  Select *pNew;
  Select *p;
  Select **pp;
  Select *pNext;
  Select *pRet;
  Select *in_stack_ffffffffffffffa8;
  sqlite3 *in_stack_ffffffffffffffb0;
  sqlite3 *in_stack_ffffffffffffffb8;
  int *local_38;
  sqlite3 *local_30;
  sqlite3 *p_00;
  Select *p_01;
  sqlite3 *db_00;
  
  db_00 = *(sqlite3 **)(in_FS_OFFSET + 0x28);
  p_01 = (Select *)0x0;
  local_30 = (sqlite3 *)0x0;
  local_38 = (int *)&stack0xfffffffffffffff0;
  p_00 = in_RSI;
  while( true ) {
    if ((in_RSI == (sqlite3 *)0x0) ||
       (in_stack_ffffffffffffffb8 =
             (sqlite3 *)
             sqlite3DbMallocRawNN(in_stack_ffffffffffffffb8,(u64)in_stack_ffffffffffffffb0),
       in_stack_ffffffffffffffb8 == (sqlite3 *)0x0)) goto LAB_001d3e65;
    pDVar2 = (Db *)sqlite3ExprListDup(db_00,(ExprList *)p_01,(int)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffffb8->aDb = pDVar2;
    pSVar3 = sqlite3SrcListDup(in_RDI,(SrcList *)p_00,in_EDX);
    *(SrcList **)&in_stack_ffffffffffffffb8->nDb = pSVar3;
    pEVar4 = sqlite3ExprDup(in_RSI,(Expr *)in_stack_ffffffffffffffb8,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    in_stack_ffffffffffffffb8->flags = (u64)pEVar4;
    pEVar5 = sqlite3ExprListDup(db_00,(ExprList *)p_01,(int)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffffb8->lastRowid = (i64)pEVar5;
    pEVar4 = sqlite3ExprDup(in_RSI,(Expr *)in_stack_ffffffffffffffb8,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    in_stack_ffffffffffffffb8->szMmap = (i64)pEVar4;
    pEVar5 = sqlite3ExprListDup(db_00,(ExprList *)p_01,(int)((ulong)in_RDI >> 0x20));
    *(ExprList **)&in_stack_ffffffffffffffb8->nSchemaLock = pEVar5;
    *(undefined1 *)&in_stack_ffffffffffffffb8->pVfs = *(undefined1 *)&in_RSI->pVfs;
    *(sqlite3 **)&in_stack_ffffffffffffffb8->errMask = local_30;
    in_stack_ffffffffffffffb8->errCode = 0;
    in_stack_ffffffffffffffb8->errByteOffset = 0;
    pEVar4 = sqlite3ExprDup(in_RSI,(Expr *)in_stack_ffffffffffffffb8,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    *(Expr **)&in_stack_ffffffffffffffb8->dbOptFlags = pEVar4;
    *(undefined4 *)&in_stack_ffffffffffffffb8->pVdbe = 0;
    *(undefined4 *)((long)&in_stack_ffffffffffffffb8->pVdbe + 4) = 0;
    *(uint *)((long)&in_stack_ffffffffffffffb8->pVfs + 4) =
         *(uint *)((long)&in_RSI->pVfs + 4) & 0xffffffdf;
    *(undefined4 *)((long)&in_stack_ffffffffffffffb8->pDfltColl + 4) = 0xffffffff;
    *(undefined4 *)&in_stack_ffffffffffffffb8->mutex = 0xffffffff;
    *(undefined2 *)((long)&in_stack_ffffffffffffffb8->pVfs + 2) =
         *(undefined2 *)((long)&in_RSI->pVfs + 2);
    pWVar6 = sqlite3WithDup(in_RSI,(With *)in_stack_ffffffffffffffb8);
    *(With **)&in_stack_ffffffffffffffb8->bBenignMalloc = pWVar6;
    in_stack_ffffffffffffffb8->nSqlExec = '\0';
    in_stack_ffffffffffffffb8->eOpenState = '\0';
    *(undefined2 *)&in_stack_ffffffffffffffb8->field_0x72 = 0;
    in_stack_ffffffffffffffb8->nextPagesize = 0;
    pWVar7 = sqlite3WindowListDup(in_RSI,(Window *)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8->nChange = (i64)pWVar7;
    lVar1._0_1_ = in_RSI->nSqlExec;
    lVar1._1_1_ = in_RSI->eOpenState;
    lVar1._2_2_ = *(undefined2 *)&in_RSI->field_0x72;
    lVar1._4_4_ = in_RSI->nextPagesize;
    if ((lVar1 != 0) && (in_RDI->mallocFailed == '\0')) {
      gatherSelectWindows(in_stack_ffffffffffffffa8);
    }
    *(undefined4 *)&in_stack_ffffffffffffffb8->pDfltColl = *(undefined4 *)&in_RSI->pDfltColl;
    if (in_RDI->mallocFailed != '\0') break;
    *(sqlite3 **)local_38 = in_stack_ffffffffffffffb8;
    local_38 = &in_stack_ffffffffffffffb8->errCode;
    in_RSI = *(sqlite3 **)&in_RSI->errCode;
    local_30 = in_stack_ffffffffffffffb8;
  }
  in_stack_ffffffffffffffb8->errMask = 0;
  in_stack_ffffffffffffffb8->iSysErrno = 0;
  sqlite3SelectDelete(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
LAB_001d3e65:
  if (*(sqlite3 **)(in_FS_OFFSET + 0x28) != db_00) {
    __stack_chk_fail();
  }
  return p_01;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, const Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  const Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = sqlite3WithDup(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    pNew->pWin = 0;
    pNew->pWinDefn = sqlite3WindowListDup(db, p->pWinDefn);
    if( p->pWin && db->mallocFailed==0 ) gatherSelectWindows(pNew);
#endif
    pNew->selId = p->selId;
    if( db->mallocFailed ){
      /* Any prior OOM might have left the Select object incomplete.
      ** Delete the whole thing rather than allow an incomplete Select
      ** to be used by the code generator. */
      pNew->pNext = 0;
      sqlite3SelectDelete(db, pNew);
      break;
    }
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }
  return pRet;
}